

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int update_traffic_key(ptls_t *tls,int is_enc)

{
  ptls_hash_algorithm_t *algo;
  size_t outlen;
  ptls_iovec_t secret_00;
  ptls_iovec_t hash_value;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *local_a0;
  ptls_hash_algorithm_t *hash;
  undefined1 local_68 [4];
  int ret;
  uint8_t secret [64];
  st_ptls_traffic_protection_t *tp;
  int is_enc_local;
  ptls_t *tls_local;
  
  if (is_enc == 0) {
    local_a0 = &tls->traffic_protection;
  }
  else {
    local_a0 = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)&(tls->traffic_protection).enc;
  }
  algo = tls->key_schedule->hashes[0].algo;
  outlen = algo->digest_size;
  secret_00 = ptls_iovec_init(local_a0,algo->digest_size);
  hash_value = ptls_iovec_init((void *)0x0,0);
  hash._4_4_ = hkdf_expand_label(algo,local_68,outlen,secret_00,"traffic upd",hash_value,
                                 tls->key_schedule->hkdf_label_prefix);
  if (hash._4_4_ == 0) {
    memcpy(local_a0,local_68,0x40);
    hash._4_4_ = setup_traffic_protection(tls,is_enc,(char *)0x0,3,1);
  }
  (*ptls_clear_memory)(local_68,0x40);
  return hash._4_4_;
}

Assistant:

static int update_traffic_key(ptls_t *tls, int is_enc)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_hash_algorithm_t *hash = tls->key_schedule->hashes[0].algo;
    if ((ret = hkdf_expand_label(hash, secret, hash->digest_size, ptls_iovec_init(tp->secret, hash->digest_size), "traffic upd",
                                 ptls_iovec_init(NULL, 0), tls->key_schedule->hkdf_label_prefix)) != 0)
        goto Exit;
    memcpy(tp->secret, secret, sizeof(secret));
    ret = setup_traffic_protection(tls, is_enc, NULL, 3, 1);

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}